

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
NLProblemBuilderTest_AddVars_Test::~NLProblemBuilderTest_AddVars_Test
          (NLProblemBuilderTest_AddVars_Test *this)

{
  NLProblemBuilderTest::~NLProblemBuilderTest(&this->super_NLProblemBuilderTest);
  return;
}

Assistant:

TEST_F(NLProblemBuilderTest, AddVars) {
  auto header = mp::NLHeader();
  header.num_vars = 42;
  EXPECT_CALL(builder, SetInfo(testing::Ref(header)));
  EXPECT_CALL(builder, AddVars(header.num_vars, mp::var::CONTINUOUS));
  adapter.OnHeader(header);
  header.num_linear_integer_vars = 42;
  EXPECT_CALL(builder, SetInfo(testing::Ref(header)));
  EXPECT_CALL(builder, AddVars(header.num_vars, mp::var::INTEGER));
  adapter.OnHeader(header);
  header.num_linear_integer_vars = 10;
  EXPECT_CALL(builder, SetInfo(testing::Ref(header)));
  EXPECT_CALL(builder, AddVars(header.num_linear_integer_vars,
                               mp::var::INTEGER));
  EXPECT_CALL(builder, AddVars(header.num_vars - header.num_linear_integer_vars,
                               mp::var::CONTINUOUS));
  adapter.OnHeader(header);
}